

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend_bench.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int extraout_EAX;
  long lVar3;
  ALLEGRO_BITMAP *b2;
  clock_t cVar4;
  clock_t cVar5;
  Mode MVar6;
  undefined8 uVar7;
  code *pcVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auStack_448 [1024];
  undefined8 uStack_48;
  
  uVar7 = 0;
  bVar1 = true;
  if (1 < argc) {
    uVar7 = 0;
    lVar3 = strtol(argv[1],(char **)0x0,10);
    iVar10 = (int)lVar3;
    if (iVar10 == 2) {
      uVar7 = 3;
    }
    else if (iVar10 == 1) {
      uVar7 = 2;
    }
    else {
      if (iVar10 != 0) goto LAB_00102404;
      uVar7 = 1;
    }
    bVar1 = false;
  }
LAB_00102404:
  pcVar8 = atexit;
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    pcVar9 = "Could not init Allegro\n";
  }
  else {
    al_init_image_addon();
    al_init_primitives_addon();
    pcVar8 = (code *)0x1e0;
    display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
    if (display != (ALLEGRO_DISPLAY *)0x0) {
      if (bVar1) {
        MVar6 = PLAIN_BLIT;
        do {
          do_test(MVar6);
          MVar6 = MVar6 + PLAIN_BLIT;
        } while (MVar6 != 4);
      }
      else {
        do_test((Mode)uVar7);
      }
      al_destroy_display(display);
      return 0;
    }
    pcVar9 = "Error creating display\n";
    display = (ALLEGRO_DISPLAY *)0x0;
  }
  abort_example(pcVar9);
  uStack_48 = uVar7;
  al_set_new_bitmap_flags(1);
  lVar3 = al_load_bitmap("data/mysha.pcx");
  if ((lVar3 != 0) &&
     (b2 = (ALLEGRO_BITMAP *)al_load_bitmap("data/allegro.pcx"), b2 != (ALLEGRO_BITMAP *)0x0)) {
    al_set_target_bitmap(lVar3);
    al_set_blender(0,1,3);
    MVar6 = (Mode)pcVar9;
    step(MVar6,b2);
    al_store_state(auStack_448,0xffff);
    al_set_target_backbuffer(display);
    al_set_blender(0,1,0);
    al_draw_bitmap(lVar3,0);
    al_flip_display();
    al_restore_state(auStack_448);
    pcVar9 = names[(ulong)pcVar9 & 0xffffffff];
    log_printf("Benchmark: %s\n");
    log_printf("Please wait...\n");
    cVar4 = clock();
    iVar10 = 100;
    do {
      step(MVar6,b2);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    cVar5 = clock();
    auVar13._0_8_ = (double)cVar5;
    auVar13._8_8_ = (double)cVar4;
    auVar13 = divpd(auVar13,_DAT_00103010);
    uVar12 = (uint)(500.0 / (auVar13._0_8_ - auVar13._8_8_));
    cVar4 = clock();
    uVar11 = uVar12;
    if (0 < (int)uVar12) {
      do {
        step(MVar6,b2);
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    cVar5 = clock();
    auVar14._0_8_ = (double)cVar5;
    auVar14._8_8_ = (double)cVar4;
    auVar13 = divpd(auVar14,_DAT_00103010);
    log_printf("Time = %g s, %d steps\n",(ulong)uVar12);
    log_printf("%s: %g FPS\n",(double)(int)uVar12 / (auVar13._0_8_ - auVar13._8_8_),pcVar9);
    log_printf("Done\n");
    al_destroy_bitmap(lVar3);
    iVar10 = al_destroy_bitmap(b2);
    return iVar10;
  }
  iVar10 = 0x103083;
  abort_example("Error loading data/mysha.pcx\n");
  if (iVar10 == 3) {
    iVar10 = al_draw_scaled_rotated_bitmap(pcVar8,0);
    return iVar10;
  }
  if (iVar10 != 2) {
    if (iVar10 != 1) {
      return extraout_EAX;
    }
    iVar10 = al_draw_bitmap(pcVar8,0);
    return iVar10;
  }
  iVar10 = al_draw_scaled_bitmap(pcVar8,0);
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
   enum Mode mode = ALL;
   int i;

   if (argc > 1) {
      i = strtol(argv[1], NULL, 10);
      switch (i) {
         case 0:
            mode = PLAIN_BLIT;
            break;
         case 1:
            mode = SCALED_BLIT;
            break;
         case 2:
            mode = ROTATE_BLIT;
            break;
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }

   open_log();

   al_init_image_addon();
   al_init_primitives_addon();
   init_platform_specific();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display\n");
   }
   
   if (mode == ALL) {
      for (mode = PLAIN_BLIT; mode <= ROTATE_BLIT; mode++) {
         do_test(mode);
      }
   }
   else {
      do_test(mode);
   }

   al_destroy_display(display);

   close_log(true);

   return 0;
}